

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForthScriptCpp.h
# Opt level: O0

void __thiscall cppforth::Forth::f_ftrunc(Forth *this)

{
  double __x;
  double local_18;
  double r1;
  Forth *this_local;
  
  requireFStackDepth(this,1,"FTRUNC");
  __x = ForthStack<double>::getTop(&this->fStack,0);
  if (__x <= 0.0) {
    local_18 = ceil(__x);
  }
  else {
    local_18 = floor(__x);
  }
  ForthStack<double>::setTop(&this->fStack,local_18);
  return;
}

Assistant:

void f_ftrunc() {
			REQUIRE_FSTACK_DEPTH(1, "FTRUNC");
			auto r1 = fStack.getTop(0);
			if (r1 > 0.0){
				r1 = std::floor(r1);
			}
			else {
				r1 = std::ceil(r1);
			}
			fStack.setTop(r1);
		}